

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

bool EndsWith(string *s,string *suffix)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  __type local_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *suffix_local;
  string *s_local;
  
  local_20 = suffix;
  suffix_local = s;
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  psVar1 = suffix_local;
  local_42 = false;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_40,(ulong)psVar1);
    local_42 = std::operator==(local_40,local_20);
  }
  s_local._7_1_ = local_42;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::~string((string *)local_40);
  }
  return (bool)(s_local._7_1_ & 1);
}

Assistant:

static bool EndsWith(const string& s, const string& suffix) {
  return (s.length() >= suffix.length() &&
          s.substr(s.length() - suffix.length()) == suffix);
}